

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1717(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1f0;
  string local_1d8;
  string local_1b8;
  SyntaxKind local_198 [12];
  Expectation local_180;
  Expectation local_c8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"( x ) - 1",&local_1f1);
  Expectation::Expectation(&local_180);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1f2);
  pEVar1 = Expectation::ambiguity(&local_180,&local_1d8);
  local_198[0] = AmbiguousCastOrBinaryExpression;
  local_198[1] = CastExpression;
  local_198[2] = TypeName;
  local_198[3] = TypedefName;
  local_198[4] = AbstractDeclarator;
  local_198[5] = UnaryMinusExpression;
  local_198[6] = IntegerConstantExpression;
  local_198[7] = 0x44e;
  local_198[8] = ParenthesizedExpression;
  local_198[9] = IdentifierName;
  local_198[10] = IntegerConstantExpression;
  __l._M_len = 0xb;
  __l._M_array = local_198;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1f0,__l,
             &local_1f3);
  pEVar1 = Expectation::AST(pEVar1,(vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                                    *)&local_1f0);
  Expectation::Expectation(&local_c8,pEVar1);
  parseExpression(this,&local_1b8,&local_c8);
  Expectation::~Expectation(&local_c8);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d8);
  Expectation::~Expectation(&local_180);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void ParserTester::case1717()
{
    parseExpression("( x ) - 1",
                    Expectation().ambiguity()
                                 .AST( { SyntaxKind::AmbiguousCastOrBinaryExpression,
                                         SyntaxKind::CastExpression,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::TypedefName,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::UnaryMinusExpression,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::SubstractExpression,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::IdentifierName,
                                         SyntaxKind::IntegerConstantExpression }));
}